

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* load(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *__return_storage_ptr__,string *fname)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  allocator local_1269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  fstream f;
  byte abStack_1228 [496];
  char buf [4096];
  
  std::fstream::fstream((string *)&f);
  std::fstream::open((string *)&f,(_Ios_Openmode)fname);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::fstream::close();
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    while ((abStack_1228[*(long *)(_f + -0x18)] & 2) == 0) {
      std::istream::getline((char *)&f,(long)buf);
      std::__cxx11::string::string((string *)&local_1268,buf,&local_1269);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::__cxx11::string_const*>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_1268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
      std::__cxx11::string::~string((string *)&local_1268);
    }
  }
  std::fstream::~fstream(&f);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> load(const std::string &fname) {
    std::fstream f;
    f.open(fname, std::ios::in);
    char buf[4096];
    if (f.is_open()) {
        std::set<std::string> set;
        while (!f.eof()) {
            f.getline(buf, sizeof(buf) / sizeof(char));
            set.insert({buf});
        }
        return set;
    }
    f.close();
    return std::set<std::string>();
}